

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerCompareModeCase::test
          (SamplerCompareModeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  bool bVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  bool local_431;
  GetNameFunc local_420;
  int local_418;
  string local_410;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  GLenum local_368;
  int local_364;
  deUint32 err_3;
  int ndx_2;
  int local_358;
  GetNameFunc local_350;
  int local_348;
  string local_340;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  GLenum local_298;
  int local_294;
  deUint32 err_2;
  int ndx_1;
  int local_288;
  GetNameFunc local_280;
  int local_278;
  string local_270;
  allocator<char> local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  GLenum local_1c8;
  GLuint local_1c4;
  deUint32 err_1;
  GLuint value_1;
  int local_1b8;
  GetNameFunc local_1b0;
  int local_1a8;
  string local_1a0;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  GLenum local_f8;
  GLint local_f4;
  deUint32 err;
  GLint value;
  int ndx;
  GLenum modes [2];
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  SamplerCompareModeCase *this_local;
  
  bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
  local_431 = true;
  if (!bVar1) {
    local_431 = isPureUintTester((this->super_SamplerTest).m_tester);
  }
  section.m_log._7_1_ = local_431;
  if (local_431 == false) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initial",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar3,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0,
               (this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Set",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(modes + 1),"Set",(allocator<char> *)((long)modes + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_b8,(string *)(modes + 1));
  std::__cxx11::string::~string((string *)(modes + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)modes + 3));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  _value = 0x884e;
  if ((section.m_log._7_1_ & 1) == 0) {
    for (local_294 = 0; local_294 < 2; local_294 = local_294 + 1) {
      glu::CallLogWrapper::glSamplerParameteri
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[local_294]);
      do {
        local_298 = glu::CallLogWrapper::glGetError(gl);
        if (local_298 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,"Got Error ",&local_319);
          EVar4 = glu::getErrorStr(local_298);
          _err_3 = EVar4.m_getName;
          local_358 = EVar4.m_value;
          local_350 = _err_3;
          local_348 = local_358;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_340,&local_350);
          std::operator+(&local_2f8,&local_318,&local_340);
          std::operator+(&local_2d8,&local_2f8,": ");
          std::operator+(&local_2b8,&local_2d8,"glSamplerParameteri");
          tcu::ResultCollector::fail(result,&local_2b8);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_318);
          std::allocator<char>::~allocator(&local_319);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[local_294],(this->super_SamplerTest).m_type);
    }
    for (local_364 = 0; local_364 < 2; local_364 = local_364 + 1) {
      glu::CallLogWrapper::glSamplerParameterf
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (float)(uint)(&value)[local_364]);
      do {
        local_368 = glu::CallLogWrapper::glGetError(gl);
        if (local_368 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,"Got Error ",&local_3e9);
          EVar4 = glu::getErrorStr(local_368);
          local_420 = EVar4.m_getName;
          local_418 = EVar4.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_410,&local_420);
          std::operator+(&local_3c8,&local_3e8,&local_410);
          std::operator+(&local_3a8,&local_3c8,": ");
          std::operator+(&local_388,&local_3a8,"glSamplerParameterf");
          tcu::ResultCollector::fail(result,&local_388);
          std::__cxx11::string::~string((string *)&local_388);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator(&local_3e9);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[local_364],(this->super_SamplerTest).m_type);
    }
  }
  else {
    for (err = 0; (int)err < 2; err = err + 1) {
      bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
      if (bVar1) {
        local_f4 = (&value)[(int)err];
        glu::CallLogWrapper::glSamplerParameterIiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_f4
                  );
        do {
          local_f8 = glu::CallLogWrapper::glGetError(gl);
          if (local_f8 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_178,"Got Error ",&local_179);
            EVar4 = glu::getErrorStr(local_f8);
            _err_1 = EVar4.m_getName;
            local_1b8 = EVar4.m_value;
            local_1b0 = _err_1;
            local_1a8 = local_1b8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1a0,&local_1b0);
            std::operator+(&local_158,&local_178,&local_1a0);
            std::operator+(&local_138,&local_158,": ");
            std::operator+(&local_118,&local_138,"glSamplerParameterIiv");
            tcu::ResultCollector::fail(result,&local_118);
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_178);
            std::allocator<char>::~allocator(&local_179);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
      }
      else {
        local_1c4 = (&value)[(int)err];
        glu::CallLogWrapper::glSamplerParameterIuiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   &local_1c4);
        do {
          local_1c8 = glu::CallLogWrapper::glGetError(gl);
          if (local_1c8 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_248,"Got Error ",&local_249);
            EVar4 = glu::getErrorStr(local_1c8);
            _err_2 = EVar4.m_getName;
            local_288 = EVar4.m_value;
            local_280 = _err_2;
            local_278 = local_288;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_280);
            std::operator+(&local_228,&local_248,&local_270);
            std::operator+(&local_208,&local_228,": ");
            std::operator+(&local_1e8,&local_208,"glSamplerParameterIuiv");
            tcu::ResultCollector::fail(result,&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_248);
            std::allocator<char>::~allocator(&local_249);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
      }
      StateQueryUtil::verifyStateSamplerParamInteger
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (&value)[(int)err],(this->super_SamplerTest).m_type);
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  return;
}

Assistant:

void SamplerCompareModeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_NONE, m_type);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Set", "Set");
		const GLenum				modes[]		= {GL_COMPARE_REF_TO_TEXTURE, GL_NONE};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(modes); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)modes[ndx];
					gl.glSamplerParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = modes[ndx];
					gl.glSamplerParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
				}

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, modes[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(modes); ++ndx)
			{
				gl.glSamplerParameteri(m_target, m_pname, modes[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, modes[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(modes); ++ndx)
			{
				gl.glSamplerParameterf(m_target, m_pname, (GLfloat)modes[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

				verifyStateSamplerParamInteger(result, gl, m_target, m_pname, modes[ndx], m_type);
			}
		}
	}
}